

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RSAPrivateKey.cpp
# Opt level: O0

ByteString * __thiscall RSAPrivateKey::serialise(RSAPrivateKey *this)

{
  ByteString *in_RDI;
  ByteString *in_stack_fffffffffffffdc0;
  ByteString *in_stack_fffffffffffffdc8;
  ByteString *in_stack_fffffffffffffde8;
  
  ByteString::serialise(in_stack_fffffffffffffde8);
  ByteString::serialise(in_stack_fffffffffffffde8);
  operator+(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  ByteString::serialise(in_stack_fffffffffffffde8);
  operator+(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  ByteString::serialise(in_stack_fffffffffffffde8);
  operator+(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  ByteString::serialise(in_stack_fffffffffffffde8);
  operator+(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  ByteString::serialise(in_stack_fffffffffffffde8);
  operator+(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  ByteString::serialise(in_stack_fffffffffffffde8);
  operator+(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  ByteString::serialise(in_stack_fffffffffffffde8);
  operator+(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  ByteString::~ByteString((ByteString *)0x150bc2);
  ByteString::~ByteString((ByteString *)0x150bcf);
  ByteString::~ByteString((ByteString *)0x150bd9);
  ByteString::~ByteString((ByteString *)0x150be6);
  ByteString::~ByteString((ByteString *)0x150bf0);
  ByteString::~ByteString((ByteString *)0x150bfd);
  ByteString::~ByteString((ByteString *)0x150c0a);
  ByteString::~ByteString((ByteString *)0x150c17);
  ByteString::~ByteString((ByteString *)0x150c24);
  ByteString::~ByteString((ByteString *)0x150c31);
  ByteString::~ByteString((ByteString *)0x150c3e);
  ByteString::~ByteString((ByteString *)0x150c4b);
  ByteString::~ByteString((ByteString *)0x150c58);
  ByteString::~ByteString((ByteString *)0x150c65);
  return in_RDI;
}

Assistant:

ByteString RSAPrivateKey::serialise() const
{
	return p.serialise() +
	       q.serialise() +
	       pq.serialise() +
	       dp1.serialise() +
	       dq1.serialise() +
	       d.serialise() +
	       n.serialise() +
	       e.serialise();
}